

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  ExpressionSyntax *pEVar2;
  SourceLocation args;
  bool bVar3;
  ParamAssignmentSyntax *pPVar4;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar5;
  SourceLocation SVar6;
  Diagnostic *diag;
  Delay3Control *pDVar7;
  char *func;
  SourceRange *args_00;
  size_t index;
  SourceRange SVar8;
  Expression *delays [3];
  SourceRange local_58;
  Expression *local_48;
  SourceRange local_40;
  undefined4 extraout_var;
  
  args_00 = &local_58;
  if ((exprs->parameters).elements.size_ - 7 < 0xfffffffffffffffa) {
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar8);
LAB_0029b837:
    args_00->startLoc = (SourceLocation)0x0;
    pDVar7 = (Delay3Control *)
             BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,(TimingControl **)args_00);
  }
  else {
    local_58.startLoc = (SourceLocation)0x0;
    local_58.endLoc = (SourceLocation)0x0;
    local_48 = (Expression *)0x0;
    index = 0;
    do {
      pPVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (&exprs->parameters,index);
      SVar1 = (pPVar4->super_SyntaxNode).kind;
      this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                        (&exprs->parameters,index)->super_SyntaxNode;
      if (SVar1 != OrderedParamAssignment) {
        SVar8 = slang::syntax::SyntaxNode::sourceRange(this);
        ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar8);
LAB_0029b832:
        args_00 = &local_40;
        goto LAB_0029b837;
      }
      pOVar5 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
      pEVar2 = (pOVar5->expr).ptr;
      if (pEVar2 == (ExpressionSyntax *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
        ;
        goto LAB_0029b881;
      }
      SVar6._0_4_ = Expression::bind((int)pEVar2,(sockaddr *)context,0);
      SVar6._4_4_ = extraout_var;
      (&local_58.startLoc)[index] = SVar6;
      if (*(Type **)((long)SVar6 + 8) == (Type *)0x0) {
LAB_0029b855:
        func = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_0029b881:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      bVar3 = Type::isNumeric(*(Type **)((long)SVar6 + 8));
      args = local_58.startLoc;
      if (!bVar3) {
        diag = ASTContext::addDiag(context,(DiagCode)0x100008,*(SourceRange *)((long)SVar6 + 0x20));
        if (*(Type **)((long)SVar6 + 8) != (Type *)0x0) {
          ast::operator<<(diag,*(Type **)((long)SVar6 + 8));
          goto LAB_0029b832;
        }
        goto LAB_0029b855;
      }
      index = index + 1;
    } while (index < (exprs->parameters).elements.size_ + 1 >> 1);
    if (local_58.startLoc == (SourceLocation)0x0) {
      assert::assertFailed
                ("delays[0]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/TimingControl.cpp"
                 ,0xf0,
                 "static TimingControl &slang::ast::Delay3Control::fromParams(Compilation &, const ParameterValueAssignmentSyntax &, const ASTContext &)"
                );
    }
    local_40 = slang::syntax::SyntaxNode::sourceRange
                         (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
    pDVar7 = BumpAllocator::
             emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,(Expression *)args,
                        (Expression **)&local_58.endLoc,&local_48,&local_40);
  }
  return &pDVar7->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}